

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmCTest *pcVar5;
  size_type sVar6;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long *plVar12;
  ostream *poVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  size_type *psVar17;
  ulong *puVar18;
  string extraOptions;
  string memoryTesterOptions;
  string suppressionsOption;
  string outputFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string testerName;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [8];
  pointer pbStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [6];
  ios_base local_198 [264];
  string local_90;
  string local_70;
  string local_50;
  
  (this->MemoryTesterEnvironmentVariable)._M_string_length = 0;
  *(this->MemoryTesterEnvironmentVariable)._M_dataplus._M_p = '\0';
  (this->MemoryTester)._M_string_length = 0;
  *(this->MemoryTester)._M_dataplus._M_p = '\0';
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  paVar16 = &local_2c8.field_2;
  local_2c8._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"MemoryCheckCommand","");
  cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
  bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar16) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &this->MemoryTester;
  if (bVar8) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2c8._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"MemoryCheckCommand","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar16) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenameName((string *)local_208,psVar1);
    lVar11 = std::__cxx11::string::find((char *)local_208,0x923fed,0);
    bVar8 = true;
    if (lVar11 == -1) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MemoryCheckType","");
      cmCTest::GetCTestConfiguration(&local_2c8,pcVar5,&local_70);
      iVar9 = std::__cxx11::string::compare((char *)&local_2c8);
      bVar8 = iVar9 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar16) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    iVar9 = 1;
    if (!bVar8) {
      lVar11 = std::__cxx11::string::find(local_208,0x924006,0);
      bVar8 = true;
      if (lVar11 == -1) {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"MemoryCheckType","");
        cmCTest::GetCTestConfiguration(&local_50,pcVar5,&local_90);
        iVar9 = std::__cxx11::string::compare((char *)&local_50);
        bVar8 = iVar9 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      iVar9 = 3;
      if (!bVar8) {
        lVar11 = std::__cxx11::string::find(local_208,0x92400f,0);
        iVar9 = 2;
        if (lVar11 == -1) {
          lVar11 = std::__cxx11::string::find(local_208,0x90eba3,0);
          iVar9 = 4;
          if (lVar11 == -1) {
            lVar11 = std::__cxx11::string::find(local_208,0x924016,0);
            iVar9 = 5;
            if (lVar11 == -1) {
              lVar11 = std::__cxx11::string::find(local_208,0x924024,0);
              iVar9 = (uint)(lVar11 != -1) * 5;
            }
          }
        }
      }
    }
    this->MemoryTesterStyle = iVar9;
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2c8._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"PurifyCommand","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
    bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar16) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2c8._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"PurifyCommand","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
      std::__cxx11::string::operator=((string *)psVar1,(string *)local_208);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar16) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2c8._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ValgrindCommand","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
      bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar16) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if (bVar8) {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_2c8._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ValgrindCommand","");
        cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
        std::__cxx11::string::operator=((string *)psVar1,(string *)local_208);
        if (local_208 != (undefined1  [8])local_1f8) {
          operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar16) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_2c8._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"DrMemoryCommand","");
        cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
        bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
        if (local_208 != (undefined1  [8])local_1f8) {
          operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar16) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) {
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_2c8._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"DrMemoryCommand","")
          ;
          cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
          std::__cxx11::string::operator=((string *)psVar1,(string *)local_208);
          if (local_208 != (undefined1  [8])local_1f8) {
            operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar16) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          this->MemoryTesterStyle = 3;
        }
        else {
          pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_2c8._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,"BoundsCheckerCommand","");
          cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
          bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
          if (local_208 != (undefined1  [8])local_1f8) {
            operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar16) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if (bVar8) {
            pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            local_2c8._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,"BoundsCheckerCommand","");
            cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
            std::__cxx11::string::operator=((string *)psVar1,(string *)local_208);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != paVar16) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            this->MemoryTesterStyle = 4;
          }
          else {
            pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
            local_2c8._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,"CudaSanitizerCommand","");
            cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
            bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != paVar16) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar8) {
              pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
              local_2c8._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2c8,"CudaSanitizerCommand","");
              cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2c8);
              std::__cxx11::string::operator=((string *)psVar1,(string *)local_208);
              if (local_208 != (undefined1  [8])local_1f8) {
                operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != paVar16) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              this->MemoryTesterStyle = 5;
            }
          }
        }
      }
    }
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  paVar16 = &local_2a8.field_2;
  local_2a8._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2a8);
  iVar9 = std::__cxx11::string::compare(local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar16) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_2a8._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2a8);
  iVar9 = std::__cxx11::string::compare(local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar16) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_2a8._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2a8);
  iVar9 = std::__cxx11::string::compare(local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar16) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_2a8._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2a8);
  iVar9 = std::__cxx11::string::compare(local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar16) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 9;
    this->LogWithPID = true;
  }
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_2a8._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2a8);
  iVar9 = std::__cxx11::string::compare(local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar16) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  if (iVar9 == 0) {
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)psVar1);
    this->MemoryTesterStyle = 10;
    this->LogWithPID = true;
  }
  if (this->MemoryTesterStyle == 0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2a8._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MemoryCheckType","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar16) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                               local_2a8.field_2._M_local_buf[0]) + 1);
    }
    iVar9 = std::__cxx11::string::compare(local_208);
    if (iVar9 == 0) {
      iVar9 = 2;
LAB_0028d1e8:
      this->MemoryTesterStyle = iVar9;
    }
    else {
      iVar9 = std::__cxx11::string::compare(local_208);
      if (iVar9 == 0) {
        iVar9 = 4;
        goto LAB_0028d1e8;
      }
      iVar9 = std::__cxx11::string::compare(local_208);
      if (iVar9 == 0) {
        iVar9 = 1;
        goto LAB_0028d1e8;
      }
      iVar9 = std::__cxx11::string::compare(local_208);
      if (iVar9 == 0) {
        iVar9 = 3;
        goto LAB_0028d1e8;
      }
      iVar9 = std::__cxx11::string::compare(local_208);
      if (iVar9 == 0) {
        iVar9 = 5;
        goto LAB_0028d1e8;
      }
    }
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->MemoryTester)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program.",
               0x52);
    std::ios::widen((char)(ostringstream *)local_208 +
                    (char)*(undefined8 *)((long)local_208 + -0x18));
    std::ostream::put((char)local_208);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x229,local_2a8._M_dataplus._M_p,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar16) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                               local_2a8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    std::ios_base::~ios_base(local_198);
    return false;
  }
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2a8._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,"MemoryCheckCommandOptions","");
  cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
  pbVar7 = pbStack_200;
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,(ulong)(local_2e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (pbVar7 == (pointer)0x0) {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"ValgrindCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
    pbVar7 = pbStack_200;
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      (ulong)(local_2e8.field_2._M_allocated_capacity + 1));
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"ValgrindCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
      goto LAB_0028d5f5;
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"DrMemoryCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
    pbVar7 = pbStack_200;
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      (ulong)(local_2e8.field_2._M_allocated_capacity + 1));
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"DrMemoryCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
      goto LAB_0028d5f5;
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"CudaSanitizerCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      (ulong)(local_2e8.field_2._M_allocated_capacity + 1));
    }
    if (pbStack_200 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"CudaSanitizerCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
      goto LAB_0028d5f5;
    }
  }
  else {
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"MemoryCheckCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
LAB_0028d5f5:
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_208);
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      (ulong)(local_2e8.field_2._M_allocated_capacity + 1));
    }
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2e8,&local_2a8);
  local_208 = (undefined1  [8])
              (this->MemoryTesterOptions).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_200 = (this->MemoryTesterOptions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8[0]._0_8_ =
       (this->MemoryTesterOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._M_dataplus._M_p;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._M_string_length;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2e8.field_2._M_allocated_capacity;
  local_2e8._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2e8);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&local_2e8,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 == paVar16) {
    local_1f8[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_1f8[0]._8_8_ = plVar12[3];
    local_208 = (undefined1  [8])local_1f8;
  }
  else {
    local_1f8[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_208 = (undefined1  [8])*plVar12;
  }
  pbStack_200 = (pointer)plVar12[1];
  *plVar12 = (long)paVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  psVar1 = &this->MemoryTesterOutputFile;
  std::__cxx11::string::operator=((string *)psVar1,(string *)local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (9 < this->MemoryTesterStyle - 1U) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Do not understand memory checker: ",0x22);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,(this->MemoryTester)._M_dataplus._M_p,
                         (this->MemoryTester)._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x305,local_2e8._M_dataplus._M_p,false);
LAB_0028e865:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    std::ios_base::~ios_base(local_198);
LAB_0028e8a1:
    bVar8 = false;
    goto LAB_0028e45d;
  }
  this_00 = &this->MemoryTesterOptions;
  switch(this->MemoryTesterStyle) {
  case 1:
    if ((this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [3])0x9a7a29);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [16])"--tool=memcheck");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [17])"--leak-check=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[21]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [21])"--show-reachable=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [17])"--num-callers=50");
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"MemoryCheckSuppressionFile","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
    pbVar7 = pbStack_200;
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_2e8);
      bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Cannot find memory checker suppression file: ",0x2d);
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_2e8,pcVar5,&local_288);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_2e8._M_dataplus._M_p,
                             local_2e8._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,599,local_2e8._M_dataplus._M_p,false);
        goto LAB_0028e865;
      }
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration(&local_2e8,pcVar5,&local_288);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     "--suppressions=",&local_2e8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   "--log-file=",psVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
    break;
  case 2:
    local_208 = (undefined1  [8])local_1f8;
    pbStack_200 = (pointer)0x0;
    local_1f8[0]._M_allocated_capacity = local_1f8[0]._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::_M_replace((ulong)local_208,0,(char *)0x0,0x92420e);
    std::__cxx11::string::_M_append
              (local_208,(ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)local_208);
    break;
  case 3:
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)local_208,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    plVar12 = (long *)std::__cxx11::string::append(local_208);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    puVar18 = (ulong *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_2e8.field_2._M_allocated_capacity = *puVar18;
      local_2e8.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *puVar18;
      local_2e8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_2e8._M_string_length = plVar12[1];
    *plVar12 = (long)puVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[7]>>
                       ((this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"-quiet");
    if (_Var14._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])0x91ebef);
    }
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[7]>>
                       ((this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"-batch");
    if (_Var14._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])"-batch");
    }
    pvVar2 = &this->MemoryTesterDynamicOptions;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[8]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (char (*) [8])"-logdir");
    _Var15 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                       ((this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"-logdir");
    if (_Var15._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_208 = (undefined1  [8])local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_208,local_2e8._M_dataplus._M_p,
                 local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
      std::__cxx11::string::append(local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar2,(value_type *)local_208);
      std::__cxx11::string::_M_assign((string *)psVar1);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar2,_Var15._M_current + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(this_00,(iterator)_Var15._M_current,_Var15._M_current + 2);
    }
    std::__cxx11::string::append((char *)psVar1);
    _Var15 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[14]>>
                       ((this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->MemoryTesterOptions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"-symcache_dir");
    if (_Var15._M_current ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[14]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
                 (char (*) [14])"-symcache_dir");
      local_208 = (undefined1  [8])local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_208,local_2e8._M_dataplus._M_p,
                 local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
      std::__cxx11::string::append(local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar2,(value_type *)local_208);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    paVar16 = &local_288.field_2;
    local_288._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_288,"MemoryCheckSuppressionFile","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_288);
    pbVar7 = pbStack_200;
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar16) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    if (pbVar7 != (pointer)0x0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_288._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_288);
      bVar8 = cmsys::SystemTools::FileExists((string *)local_208);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar16) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Cannot find memory checker suppression file: ",0x2d);
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_288,pcVar5,&local_248);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_288._M_dataplus._M_p,
                             local_288._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar16) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x290,local_288._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar16) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
        std::ios_base::~ios_base(local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0028e8a1;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [10])"-suppress");
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_288._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_208,pcVar5,&local_288);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
      if (local_208 != (undefined1  [8])local_1f8) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar16) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])0x98eaa9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0028e452;
  case 4:
    std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerXMLFile);
    cmCTest::GetBinaryDir_abi_cxx11_
              (&local_2e8,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_208 = (undefined1  [8])local_1f8;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar16) {
      local_1f8[0]._0_8_ = paVar16->_M_allocated_capacity;
      local_1f8[0]._8_8_ = plVar12[3];
    }
    else {
      local_1f8[0]._0_8_ = paVar16->_M_allocated_capacity;
      local_208 = (undefined1  [8])*plVar12;
    }
    pbStack_200 = (pointer)plVar12[1];
    *plVar12 = (long)paVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerDPBDFile);
    pvVar2 = &this->MemoryTesterDynamicOptions;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (char (*) [3])0x910fbe);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar2,
               (char (*) [3])"/X");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pvVar2,psVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])"/M");
    break;
  case 5:
    if ((this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->MemoryTesterOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [7])"--tool");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [9])0x91f28d);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [13])"--leak-check");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [5])0x9cce13);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [11])"--log-file");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,psVar1);
    goto LAB_0028e452;
  default:
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [4])0x92b3c1);
    local_208 = (undefined1  [8])local_1f8;
    pbStack_200 = (pointer)0x0;
    local_1f8[0]._M_allocated_capacity = local_1f8[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_allocated_capacity =
         local_2e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    paVar16 = &local_268.field_2;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_268._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"MemoryCheckSanitizerOptions","");
    cmCTest::GetCTestConfiguration(&local_248,pcVar5,&local_268);
    sVar6 = local_248._M_string_length;
    paVar3 = &local_248.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar3) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar16) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (sVar6 != 0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"MemoryCheckSanitizerOptions","");
      cmCTest::GetCTestConfiguration(&local_268,pcVar5,&local_228);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x96a490);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_248.field_2._M_allocated_capacity = *psVar17;
        local_248.field_2._8_8_ = plVar12[3];
        local_248._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar17;
        local_248._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_248._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar3) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar16) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"MemoryCheckSuppressionFile","");
    cmCTest::GetCTestConfiguration(&local_248,pcVar5,&local_268);
    sVar6 = local_248._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar3) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar16) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (sVar6 != 0) {
      pcVar5 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration(&local_268,pcVar5,&local_228);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x9242ca);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_248.field_2._M_allocated_capacity = *psVar17;
        local_248.field_2._8_8_ = plVar12[3];
        local_248._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar17;
        local_248._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_248._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_288,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar3) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar16) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
    }
    uVar10 = this->MemoryTesterStyle - 6;
    if (uVar10 < 5) {
      std::__cxx11::string::_M_replace
                ((ulong)local_208,0,(char *)pbStack_200,
                 (ulong)(&DAT_00923bfc + *(int *)(&DAT_00923bfc + (ulong)uVar10 * 4)));
    }
    paVar4 = &local_228.field_2;
    local_228._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_208,
               (char *)((long)local_208 + (long)&pbStack_200->_M_dataplus));
    std::__cxx11::string::append((char *)&local_228);
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_228,
                                 (ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_268.field_2._M_allocated_capacity = *psVar17;
      local_268.field_2._8_8_ = plVar12[3];
      local_268._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar17;
      local_268._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_268._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_268);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_248.field_2._M_allocated_capacity = *psVar17;
      local_248.field_2._8_8_ = plVar12[3];
      local_248._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar17;
      local_248._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_248._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar16) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar4) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_228,&local_248,&local_288);
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_228,(ulong)local_2e8._M_dataplus._M_p);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_268.field_2._M_allocated_capacity = *psVar17;
      local_268.field_2._8_8_ = plVar12[3];
      local_268._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_268.field_2._M_allocated_capacity = *psVar17;
      local_268._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_268._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar16) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar4) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar3) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
LAB_0028e452:
  bVar8 = true;
  InitializeResultsVectors(this);
LAB_0028e45d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  return bVar8;
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("drmemory") != std::string::npos ||
               this->CTest->GetCTestConfiguration("MemoryCheckType") ==
                 "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (testerName.find("cuda-memcheck") != std::string::npos ||
               testerName.find("compute-sanitizer") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("DrMemoryCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("DrMemoryCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("CudaSanitizerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = cmSystemTools::GetCMakeCommand();
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (checkType == "DrMemory") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::DRMEMORY;
    } else if (checkType == "CudaSanitizer") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::CUDA_SANITIZER;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("DrMemoryCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("DrMemoryCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("CudaSanitizerCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::DRMEMORY: {
      std::string tempDrMemoryDir =
        this->CTest->GetBinaryDir() + "/Testing/Temporary/DrMemory";

      if (!cm::contains(this->MemoryTesterOptions, "-quiet")) {
        this->MemoryTesterOptions.emplace_back("-quiet");
      }

      if (!cm::contains(this->MemoryTesterOptions, "-batch")) {
        this->MemoryTesterOptions.emplace_back("-batch");
      }

      this->MemoryTesterDynamicOptions.emplace_back("-logdir");
      auto logdirOption =
        std::find(this->MemoryTesterOptions.begin(),
                  this->MemoryTesterOptions.end(), "-logdir");
      if (logdirOption == this->MemoryTesterOptions.end()) {
        // No logdir found in memory tester options
        std::string drMemoryLogDir = tempDrMemoryDir + "/??";
        this->MemoryTesterDynamicOptions.push_back(drMemoryLogDir);
        this->MemoryTesterOutputFile = drMemoryLogDir;
      } else {
        // Use logdir found in memory tester options
        auto logdirLocation = std::next(logdirOption);
        this->MemoryTesterOutputFile = *logdirLocation;
        this->MemoryTesterDynamicOptions.push_back(*logdirLocation);
        this->MemoryTesterOptions.erase(logdirOption, logdirLocation + 1);
      }
      this->MemoryTesterOutputFile += "/*/results.txt";

      if (std::find(this->MemoryTesterOptions.begin(),
                    this->MemoryTesterOptions.end(),
                    "-symcache_dir") == this->MemoryTesterOptions.end()) {
        this->MemoryTesterDynamicOptions.emplace_back("-symcache_dir");
        std::string drMemoryCacheDir = tempDrMemoryDir + "/cache";
        this->MemoryTesterDynamicOptions.push_back(drMemoryCacheDir);
      }

      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.emplace_back("-suppress");
        this->MemoryTesterOptions.push_back(
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }

      this->MemoryTesterOptions.emplace_back("--");

      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    case cmCTestMemCheckHandler::CUDA_SANITIZER: {
      // cuda sanitizer separates flags from arguments by spaces
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("--tool");
        this->MemoryTesterOptions.emplace_back("memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check");
        this->MemoryTesterOptions.emplace_back("full");
      }
      this->MemoryTesterDynamicOptions.emplace_back("--log-file");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}